

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O3

char minijson::detail::read_unquoted_value<minijson::buffer_context>
               (buffer_context *context,char first_char)

{
  byte bVar1;
  ulong uVar2;
  size_t sVar3;
  int iVar4;
  undefined8 *puVar5;
  char *in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *__buf;
  long lVar6;
  int __fd;
  
  if (first_char == '\0') goto LAB_0010696f;
  __fd = (int)first_char;
  do {
    buffer_context_base::write(&context->super_buffer_context_base,__fd,in_RDX,(size_t)in_RCX);
LAB_0010696f:
    uVar2 = (context->super_buffer_context_base).m_read_offset;
    if ((context->super_buffer_context_base).m_length <= uVar2) goto LAB_001069d1;
    in_RCX = (context->super_buffer_context_base).m_read_buffer;
    __buf = (void *)(uVar2 + 1);
    (context->super_buffer_context_base).m_read_offset = (size_t)__buf;
    bVar1 = in_RCX[uVar2];
    if (bVar1 < 0x5d) {
      if (bVar1 == 0x2c) goto LAB_001069c0;
      if (bVar1 == 0) goto LAB_001069d1;
    }
    else if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) goto LAB_001069c0;
    __fd = (int)(char)bVar1;
    iVar4 = isspace(__fd);
    in_RDX = extraout_RDX;
  } while (iVar4 == 0);
  __buf = extraout_RDX;
  if (bVar1 != 0) {
LAB_001069c0:
    buffer_context_base::write(&context->super_buffer_context_base,0,__buf,(size_t)in_RCX);
    return bVar1;
  }
LAB_001069d1:
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar5 = &PTR__exception_0010ad60;
  sVar3 = (context->super_buffer_context_base).m_read_offset;
  lVar6 = 0;
  if (sVar3 != 0) {
    lVar6 = sVar3 - 1;
  }
  puVar5[1] = lVar6;
  *(undefined4 *)(puVar5 + 2) = 7;
  __cxa_throw(puVar5,&parse_error::typeinfo,std::exception::~exception);
}

Assistant:

char read_unquoted_value(Context& context, char first_char = 0)
{
    if (first_char != 0)
    {
        context.write(first_char);
    }

    char c;

    while (((c = context.read()) != 0) && (c != ',') && (c != '}') && (c != ']') && !isspace(c))
    {
        context.write(c);
    }

    if (c == 0)
    {
        throw parse_error(context, parse_error::UNTERMINATED_VALUE);
    }

    context.write(0);

    return c; // return the termination character (or it will be lost forever)
}